

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

wchar_t get_use_device_chance(object *obj)

{
  int iVar1;
  int local_2c;
  wchar_t local_28;
  wchar_t local_24;
  wchar_t skill;
  wchar_t x;
  wchar_t fail;
  wchar_t lev;
  object *obj_local;
  
  if (obj->artifact == (artifact *)0x0) {
    if (obj->activation == (activation *)0x0) {
      local_28 = obj->kind->level;
    }
    else {
      local_28 = obj->activation->level;
    }
    local_24 = local_28;
  }
  else {
    local_24 = obj->artifact->level;
  }
  local_2c = ((player->state).skills[2] - local_24) * 2 + 1;
  iVar1 = local_2c * -0x172;
  if (local_2c < 0) {
    local_2c = -local_2c;
  }
  return iVar1 / (local_2c + 5) + L'ż';
}

Assistant:

int get_use_device_chance(const struct object *obj)
{
	int lev, fail, x;
	int skill = player->state.skills[SKILL_DEVICE];

	/* Extract the item level, which is the difficulty rating */
	lev = obj->artifact ? obj->artifact->level :
		(obj->activation ? obj->activation->level : obj->kind->level);

	/* Calculate x */
	x = 2 * (skill - lev) + 1;

	/* Now calculate the failure rate */
	fail = -370 * x;
	fail /= (5 + ABS(x));
	fail += 380;

	return fail;
}